

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_util.c
# Opt level: O3

int SampleUtil_Finish(void)

{
  pthread_mutex_destroy((pthread_mutex_t *)&display_mutex);
  gPrintFun = (print_string)0x0;
  gStateUpdateFun = (state_update)0x0;
  initialize_init = 0;
  initialize_register = 0;
  return 0;
}

Assistant:

int SampleUtil_Finish()
{
	ithread_mutex_destroy(&display_mutex);
	gPrintFun = NULL;
	gStateUpdateFun = NULL;
	initialize_init = 1;
	initialize_register = 1;

	return UPNP_E_SUCCESS;
}